

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

vec3 golf_entity_get_velocity(golf_level_t *level,golf_entity_t *entity,float t,vec3 world_point)

{
  golf_transform_t transform;
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  golf_transform_t transform_01;
  golf_transform_t transform_02;
  mat4 m_01;
  golf_movement_t *pgVar1;
  vec3 vVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  vec3 world_point1;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  vec3 local_point;
  mat4 model_mat1;
  mat4 model_mat0;
  undefined1 auStack_110 [8];
  golf_transform_t transform1;
  undefined1 auStack_b8 [8];
  golf_transform_t transform0;
  golf_transform_t world_transform;
  float t1;
  float t0;
  golf_movement_t *movement;
  float dt;
  float t_local;
  golf_entity_t *entity_local;
  golf_level_t *level_local;
  vec3 world_point_local;
  vec3 velocity;
  
  pgVar1 = golf_entity_get_movement(entity);
  if (pgVar1 == (golf_movement_t *)0x0) {
    vVar2 = vec3_create(0.0,0.0,0.0);
    velocity.x = vVar2.z;
    world_point_local._4_8_ = vVar2._0_8_;
  }
  else {
    golf_entity_get_world_transform((golf_transform_t *)&transform0.scale.y,level,entity);
    transform1.scale._4_8_ = *(undefined8 *)pgVar1;
    transform._8_8_ = world_transform.position._0_8_;
    transform.position.x = transform0.scale.y;
    transform.position.y = transform0.scale.z;
    transform.rotation._4_8_ = world_transform._8_8_;
    transform._24_8_ = world_transform.rotation._4_8_;
    transform.scale._4_8_ = world_transform._24_8_;
    golf_transform_apply_movement((golf_transform_t *)auStack_b8,transform,*pgVar1,t);
    uVar3._0_4_ = pgVar1->type;
    uVar3._4_1_ = pgVar1->repeats;
    uVar3._5_3_ = *(undefined3 *)&pgVar1->field_0x5;
    uVar4 = *(undefined8 *)((long)&pgVar1->field_4 + 8);
    transform_00._8_8_ = world_transform.position._0_8_;
    transform_00.position.x = transform0.scale.y;
    transform_00.position.y = transform0.scale.z;
    transform_00.rotation._4_8_ = world_transform._8_8_;
    transform_00._24_8_ = world_transform.rotation._4_8_;
    transform_00.scale._4_8_ = world_transform._24_8_;
    golf_transform_apply_movement((golf_transform_t *)auStack_110,transform_00,*pgVar1,t + 0.001);
    transform_01.position.z = transform0.position.z;
    transform_01.rotation.x = transform0.rotation.x;
    transform_01.position.x = transform0.position.x;
    transform_01.position.y = transform0.position.y;
    transform_01.rotation.y = transform0.rotation.y;
    transform_01.rotation.z = transform0.rotation.z;
    transform_01.rotation.w = transform0.rotation.w;
    transform_01.scale.x = transform0.scale.x;
    transform_01.scale.y = (float)(int)uVar3;
    transform_01.scale.z = (float)(int)((ulong)uVar3 >> 0x20);
    golf_transform_get_model_mat(transform_01);
    transform_02.position.z = transform1.position.z;
    transform_02.rotation.x = transform1.rotation.x;
    transform_02.position.x = transform1.position.x;
    transform_02.position.y = transform1.position.y;
    transform_02.rotation.y = transform1.rotation.y;
    transform_02.rotation.z = transform1.rotation.z;
    transform_02.rotation.w = transform1.rotation.w;
    transform_02.scale.x = transform1.scale.x;
    transform_02.scale.y = (float)(int)uVar3;
    transform_02.scale.z = (float)(int)((ulong)uVar3 >> 0x20);
    golf_transform_get_model_mat(transform_02);
    m_01.m._8_8_ = model_mat0.m._8_8_;
    m_01.m._0_8_ = model_mat0.m._0_8_;
    m_01.m._16_8_ = model_mat0.m._16_8_;
    m_01.m._24_8_ = model_mat0.m._24_8_;
    m_01.m._32_8_ = model_mat0.m._32_8_;
    m_01.m._40_8_ = model_mat0.m._40_8_;
    m_01.m._48_8_ = model_mat0.m._48_8_;
    m_01.m[0xe] = (float)(int)uVar4;
    m_01.m[0xf] = (float)(int)((ulong)uVar4 >> 0x20);
    mat4_inverse(m_01);
    m.m._8_8_ = uStack_200;
    m.m._0_8_ = local_208;
    m.m._16_8_ = local_1f8;
    m.m._24_8_ = uStack_1f0;
    m.m._32_8_ = local_1e8;
    m.m._40_8_ = uStack_1e0;
    m.m._48_8_ = local_1d8;
    m.m._56_8_ = uStack_1d0;
    vVar2 = vec3_apply_mat4(world_point,1.0,m);
    m_00.m._8_8_ = model_mat1.m._0_8_;
    m_00.m._0_8_ = stack0xfffffffffffffe48;
    m_00.m._16_8_ = model_mat1.m._8_8_;
    m_00.m._24_8_ = model_mat1.m._16_8_;
    m_00.m._32_8_ = model_mat1.m._24_8_;
    m_00.m._40_8_ = model_mat1.m._32_8_;
    m_00.m._48_8_ = model_mat1.m._40_8_;
    m_00.m._56_8_ = model_mat1.m._48_8_;
    vVar2 = vec3_apply_mat4(vVar2,1.0,m_00);
    vVar2 = vec3_sub(vVar2,world_point);
    vVar2 = vec3_scale(vVar2,999.99994);
    velocity.x = vVar2.z;
    world_point_local._4_8_ = vVar2._0_8_;
  }
  vVar2.z = velocity.x;
  vVar2.x = world_point_local.y;
  vVar2.y = world_point_local.z;
  return vVar2;
}

Assistant:

vec3 golf_entity_get_velocity(golf_level_t *level, golf_entity_t *entity, float t, vec3 world_point) {
    float dt = 0.001f;
    golf_movement_t *movement = golf_entity_get_movement(entity);
    if (!movement) {
        return V3(0, 0, 0);
    }

    float t0 = t;
    float t1 = t + dt;

    golf_transform_t world_transform = golf_entity_get_world_transform(level, entity);
    golf_transform_t transform0 = golf_transform_apply_movement(world_transform, *movement, t0);
    golf_transform_t transform1 = golf_transform_apply_movement(world_transform, *movement, t1);
    mat4 model_mat0 = golf_transform_get_model_mat(transform0);
    mat4 model_mat1 = golf_transform_get_model_mat(transform1);
    vec3 local_point = vec3_apply_mat4(world_point, 1, mat4_inverse(model_mat0));
    vec3 world_point1 = vec3_apply_mat4(local_point, 1, model_mat1);

    vec3 velocity = vec3_scale(vec3_sub(world_point1, world_point), 1 / dt);
    return velocity;
}